

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

void P_BloodSplatter(DVector3 *pos,AActor *originator,DAngle *hitangle)

{
  byte *pbVar1;
  uint kind;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined4 extraout_var;
  PClassActor *type;
  AActor *pAVar6;
  uint uVar7;
  DAngle local_38;
  PClass *pPVar5;
  
  pPVar5 = (originator->super_DThinker).super_DObject.Class;
  if (pPVar5 == (PClass *)0x0) {
    iVar2 = (**(originator->super_DThinker).super_DObject._vptr_DObject)(originator);
    pPVar5 = (PClass *)CONCAT44(extraout_var,iVar2);
    (originator->super_DThinker).super_DObject.Class = pPVar5;
  }
  kind = *(uint *)&pPVar5[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                   VisitNext;
  type = AActor::GetBloodType(originator,1);
  uVar7 = cl_bloodtype.Value;
  if (type != (PClassActor *)0x0) {
    uVar7 = (*(int *)((type->super_PClass).Defaults + 0x198) << 4) >> 0x1f & cl_bloodtype.Value;
    pAVar6 = AActor::StaticSpawn(type,pos,NO_REPLACE,false);
    (pAVar6->target).field_0.p = originator;
    uVar3 = FRandom::GenRand32(&pr_splatter);
    uVar4 = FRandom::GenRand32(&pr_splatter);
    (pAVar6->Vel).X = (double)(int)((uVar3 & 0xff) - (uVar4 & 0xff)) * 0.015625;
    uVar3 = FRandom::GenRand32(&pr_splatter);
    uVar4 = FRandom::GenRand32(&pr_splatter);
    (pAVar6->Vel).Y = (double)(int)((uVar3 & 0xff) - (uVar4 & 0xff)) * 0.015625;
    (pAVar6->Vel).Z = 3.0;
    if ((kind != 0) && (((pAVar6->flags2).Value & 0x10000) == 0)) {
      pAVar6->Translation = kind >> 0x18 | 0x80000;
    }
    if (1 < (int)uVar7) {
      pbVar1 = (byte *)((long)&(pAVar6->renderflags).Value + 1);
      *pbVar1 = *pbVar1 | 0x80;
      goto LAB_00553e89;
    }
  }
  if ((int)uVar7 < 1) {
    return;
  }
LAB_00553e89:
  local_38.Degrees = hitangle->Degrees + -180.0;
  P_DrawSplash2(0x28,pos,&local_38,2,kind);
  return;
}

Assistant:

void P_BloodSplatter (const DVector3 &pos, AActor *originator, DAngle hitangle)
{
	PalEntry bloodcolor = originator->GetBloodColor();
	PClassActor *bloodcls = originator->GetBloodType(1); 

	int bloodtype = cl_bloodtype;
	
	if (bloodcls != NULL && !(GetDefaultByType(bloodcls)->flags4 & MF4_ALLOWPARTICLES))
		bloodtype = 0;

	if (bloodcls != NULL)
	{
		AActor *mo;

		mo = Spawn(bloodcls, pos, NO_REPLACE); // GetBloodType already performed the replacement
		mo->target = originator;
		mo->Vel.X = pr_splatter.Random2 () / 64.;
		mo->Vel.Y = pr_splatter.Random2() / 64.;
		mo->Vel.Z = 3;

		// colorize the blood!
		if (bloodcolor!=0 && !(mo->flags2 & MF2_DONTTRANSLATE)) 
		{
			mo->Translation = TRANSLATION(TRANSLATION_Blood, bloodcolor.a);
		}

		if (!(bloodtype <= 1)) mo->renderflags |= RF_INVISIBLE;
	}
	if (bloodtype >= 1)
	{
		P_DrawSplash2 (40, pos, hitangle-180., 2, bloodcolor);
	}
}